

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O3

bool_t xdr_bool(XDR *__xdrs,bool_t *__bp)

{
  int *piVar1;
  uint *puVar2;
  xdr_op xVar3;
  uint uVar4;
  char cVar5;
  bool_t bVar6;
  undefined8 in_RAX;
  uint local_c;
  
  xVar3 = __xdrs[2].x_op;
  bVar6 = (bool_t)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (xVar3 == XDR_FREE) {
    return bVar6;
  }
  if (xVar3 == XDR_DECODE) {
    puVar2 = *(uint **)&__xdrs->x_handy + 1;
    if (__xdrs[1].x_private < puVar2) {
      cVar5 = (*(code *)**(undefined8 **)__xdrs)(__xdrs,&local_c);
      if (cVar5 == '\0') goto LAB_00115067;
    }
    else {
      uVar4 = **(uint **)&__xdrs->x_handy;
      local_c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      *(uint **)&__xdrs->x_handy = puVar2;
    }
    *__bp = (uint)(local_c != 0);
    bVar6 = (bool_t)CONCAT71((uint7)(uint3)(local_c >> 8),1);
  }
  else {
    if (xVar3 == XDR_ENCODE) {
      piVar1 = *(int **)&__xdrs->x_handy + 1;
      if (piVar1 <= __xdrs[1].x_base) {
        **(int **)&__xdrs->x_handy = (uint)(*__bp != 0) << 0x18;
        *(int **)&__xdrs->x_handy = piVar1;
        return bVar6;
      }
      bVar6 = (**(code **)(*(long *)__xdrs + 8))(__xdrs,*__bp != 0);
      return bVar6;
    }
LAB_00115067:
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

static inline bool
xdr_bool(XDR *xdrs, bool_t *bp)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (xdr_putbool(xdrs, *bp));

	case XDR_DECODE:
		return (xdr_getbool(xdrs, bp));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}